

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O0

void Fire(int Cooling,int Sparking,int SpeedDelay)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int local_28;
  int j;
  int y;
  int k;
  int i;
  int cooldown;
  int SpeedDelay_local;
  int Sparking_local;
  int Cooling_local;
  
  for (y = 0; y < 0x18; y = y + 1) {
    iVar2 = myRandom(0,(Cooling * 10) / 0x18 + 2);
    if ((int)(uint)Fire::heat[y] < iVar2) {
      Fire::heat[y] = '\0';
    }
    else {
      Fire::heat[y] = Fire::heat[y] - (char)iVar2;
    }
  }
  for (j = 0x17; 1 < j; j = j + -1) {
    Fire::heat[j] =
         (byte)((ulong)((uint)Fire::heat[j + -1] + (uint)Fire::heat[j + -2] +
                       (uint)Fire::heat[j + -2]) / 3);
  }
  iVar2 = myRandom(0,0xff);
  if (iVar2 < Sparking) {
    iVar2 = myRandom(0,7);
    bVar1 = Fire::heat[iVar2];
    iVar3 = myRandom(0xa0,0xff);
    Fire::heat[iVar2] = bVar1 + (char)iVar3;
  }
  for (local_28 = 0; local_28 < 0x18; local_28 = local_28 + 1) {
    setPixelHeatColor(local_28,Fire::heat[local_28]);
  }
  showStrip();
  delay(SpeedDelay);
  return;
}

Assistant:

void Fire(int Cooling, int Sparking, int SpeedDelay) {
    static byte heat[NUM_LEDS];
    int cooldown;

    // Step 1.  Cool down every cell a little
    for( int i = 0; i < NUM_LEDS; i++) {
        cooldown = myRandom(0, ((Cooling * 10) / NUM_LEDS) + 2);

        if(cooldown>heat[i]) {
            heat[i]=0;
        } else {
            heat[i]=heat[i]-cooldown;
        }
    }

    // Step 2.  Heat from each cell drifts 'up' and diffuses a little
    for( int k= NUM_LEDS - 1; k >= 2; k--) {
        heat[k] = (heat[k - 1] + heat[k - 2] + heat[k - 2]) / 3;
    }

    // Step 3.  Randomly ignite new 'sparks' near the bottom
    if( myRandom(0, 255) < Sparking ) {
        int y = myRandom(0, 7);
        heat[y] = heat[y] + myRandom(160,255);
        //heat[y] = random(160,255);
    }

    // Step 4.  Convert heat to LED colors
    for( int j = 0; j < NUM_LEDS; j++) {
        setPixelHeatColor(j, heat[j] );
    }

    showStrip();
    delay(SpeedDelay);
}